

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spongerng.c
# Opt level: O0

decaf_error_t
decaf_spongerng_init_from_file(decaf_keccak_prng_s *prng,char *file,size_t len,int deterministic)

{
  int __fd;
  int in_ECX;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  uint8_t nope;
  ssize_t red;
  uint8_t buffer [128];
  int fd;
  decaf_kparams_s *in_stack_ffffffffffffff28;
  decaf_keccak_sponge_s *in_stack_ffffffffffffff30;
  ulong __nbytes;
  undefined1 *__buf;
  uint8_t *in_stack_ffffffffffffff48;
  decaf_keccak_sponge_s *in_stack_ffffffffffffff50;
  uint8_t *in_stack_ffffffffffffff58;
  decaf_keccak_prng_s *in_stack_ffffffffffffff60;
  ulong local_20;
  decaf_error_t local_4;
  
  decaf_sha3_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *(byte *)(in_RDI + 0xcf) = (in_ECX != 0 ^ 0xffU) & 1;
  if (in_RDX == 0) {
    local_4 = DECAF_FAILURE;
  }
  else {
    __fd = open(in_RSI,0);
    local_20 = in_RDX;
    if (__fd < 0) {
      local_4 = DECAF_FAILURE;
    }
    else {
      for (; local_20 != 0; local_20 = local_20 - (long)in_stack_ffffffffffffff50) {
        __buf = &stack0xffffffffffffff58;
        if (local_20 < 0x81) {
          __nbytes = local_20 & 0xffffffff;
        }
        else {
          __nbytes = 0x80;
        }
        in_stack_ffffffffffffff50 = (decaf_keccak_sponge_s *)read(__fd,__buf,__nbytes);
        if ((long)in_stack_ffffffffffffff50 < 1) {
          close(__fd);
          return DECAF_FAILURE;
        }
        decaf_sha3_update(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)__buf);
      }
      close(__fd);
      decaf_spongerng_stir
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 (size_t)in_stack_ffffffffffffff50);
      local_4 = DECAF_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

decaf_error_t decaf_spongerng_init_from_file (
    decaf_keccak_prng_t prng,
    const char *file,
    size_t len,
    int deterministic
) {
    decaf_sha3_init(prng->sponge,&DECAF_SHAKE256_params_s);
    prng->sponge->params->remaining = !deterministic; /* A bit of a hack; this param is ignored for SHAKE */
    if (!len) return DECAF_FAILURE;

#if defined _MSC_VER
    /* no /dev/urandom on windows, use rand_s instead */
    if (strcmp(file, "/dev/urandom") == 0) {
        unsigned int r;
        uint8_t buffer[sizeof(unsigned int)];
        errno_t err;
        while (len) {
            int i;
            err = rand_s(&r);
            if (err != 0) {
                return DECAF_FAILURE;
            }
            for (i = 0; i < sizeof(unsigned int); i++) {
                buffer[i] = (uint8_t)(r & 0xff);
                r >>= 8;
            }
            size_t consumed = (len > sizeof(buffer)) ? sizeof(buffer) : len;
            decaf_sha3_update(prng->sponge, buffer, consumed);
            len -= consumed;
	}
    } else {
#endif /* _MSC_VER */

    int fd = open(file, O_RDONLY);
    if (fd < 0) return DECAF_FAILURE;
    
    uint8_t buffer[128];
    while (len) {
        ssize_t red = read(fd, buffer, (len > sizeof(buffer)) ? sizeof(buffer) : (unsigned int)len);
        if (red <= 0) {
            close(fd);
            return DECAF_FAILURE;
        }
        decaf_sha3_update(prng->sponge,buffer,red);
        len -= red;
    };
    close(fd);
#if defined _MSC_VER
    }
#endif /* _MSC_VER */
    const uint8_t nope;
    decaf_spongerng_stir(prng,&nope,0);
    
    return DECAF_SUCCESS;
}